

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadPlaMo.c
# Opt level: O2

int Mop_ManMergeDist1Pairs2(Mop_Man_t *p,Vec_Int_t *vGroup,Vec_Int_t *vGroupPrev)

{
  uint nWords;
  int i;
  int iVar1;
  int iVar2;
  word *pCube1;
  word *pCube2;
  word *pBig;
  word *pSmall;
  ulong uVar3;
  ulong uVar4;
  int i_00;
  int i_01;
  int local_5c;
  
  local_5c = 0;
  i_01 = 0;
  do {
    if (vGroup->nSize <= i_01) {
      if (local_5c != 0) {
        Map_ManGroupCompact(vGroup);
      }
      return local_5c;
    }
    i = Vec_IntEntry(vGroup,i_01);
    if (i != -1) {
      pCube1 = Mop_ManCubeIn(p,i);
      i_00 = i_01;
LAB_002e061a:
      i_00 = i_00 + 1;
      if (i_00 < vGroup->nSize) {
        iVar1 = Vec_IntEntry(vGroup,i_00);
        if (iVar1 != -1) {
          pCube2 = Mop_ManCubeIn(p,iVar1);
          iVar2 = Mop_ManCheckDist1(pCube1,pCube2,p->nWordsIn);
          if (iVar2 != 0) {
            pBig = Mop_ManCubeOut(p,i);
            pSmall = Mop_ManCubeOut(p,iVar1);
            nWords = p->nWordsOut;
            iVar2 = bcmp(pBig,pSmall,(long)(int)nWords * 8);
            if (iVar2 == 0) {
              __assert_fail("memcmp(pCube1Out, pCube2Out, sizeof(word)*p->nWordsOut)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioReadPlaMo.c"
                            ,0x226,
                            "int Mop_ManMergeDist1Pairs2(Mop_Man_t *, Vec_Int_t *, Vec_Int_t *)");
            }
            iVar2 = Mop_ManCheckContain(pBig,pSmall,nWords);
            if (iVar2 == 0) {
              iVar1 = Mop_ManCheckContain(pSmall,pBig,nWords);
              if (iVar1 == 0) goto LAB_002e061a;
              uVar3 = (ulong)(uint)p->nWordsIn;
              if (p->nWordsIn < 1) {
                uVar3 = 0;
              }
              for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
                pCube1[uVar4] = pCube1[uVar4] & pCube2[uVar4];
              }
              if ((int)nWords < 1) {
                nWords = 0;
              }
              for (uVar3 = 0; iVar1 = i, iVar2 = i_01, nWords != uVar3; uVar3 = uVar3 + 1) {
                pSmall[uVar3] = pSmall[uVar3] & ~pBig[uVar3];
              }
            }
            else {
              uVar3 = (ulong)(uint)p->nWordsIn;
              if (p->nWordsIn < 1) {
                uVar3 = 0;
              }
              for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
                pCube2[uVar4] = pCube2[uVar4] & pCube1[uVar4];
              }
              if ((int)nWords < 1) {
                nWords = 0;
              }
              for (uVar3 = 0; iVar2 = i_00, nWords != uVar3; uVar3 = uVar3 + 1) {
                pBig[uVar3] = pBig[uVar3] & ~pSmall[uVar3];
              }
            }
            Vec_IntPush(vGroupPrev,iVar1);
            Vec_IntWriteEntry(vGroup,iVar2,-1);
            local_5c = local_5c + 1;
          }
        }
        goto LAB_002e061a;
      }
    }
    i_01 = i_01 + 1;
  } while( true );
}

Assistant:

int Mop_ManMergeDist1Pairs2( Mop_Man_t * p, Vec_Int_t * vGroup, Vec_Int_t * vGroupPrev )
{
    int w, c1, c2, iCube1, iCube2, Count = 0;
    Vec_IntForEachEntry( vGroup, iCube1, c1 )
    if ( iCube1 != -1 )
    {
        word * pCube1Out, * pCube1 = Mop_ManCubeIn( p, iCube1 );
        Vec_IntForEachEntryStart( vGroup, iCube2, c2, c1+1 )
        if ( iCube2 != -1 )
        {
            word * pCube2Out, * pCube2 = Mop_ManCubeIn( p, iCube2 );
            if ( !Mop_ManCheckDist1(pCube1, pCube2, p->nWordsIn) )
                continue;
            pCube1Out = Mop_ManCubeOut( p, iCube1 );
            pCube2Out = Mop_ManCubeOut( p, iCube2 );
            assert( memcmp(pCube1Out, pCube2Out, sizeof(word)*p->nWordsOut) );
            if ( Mop_ManCheckContain(pCube1Out, pCube2Out, p->nWordsOut) ) // pCube1 has more outputs
            {
                // update the input part
                for ( w = 0; w < p->nWordsIn; w++ )
                    pCube2[w] &= pCube1[w];
                // sharp the output part
                for ( w = 0; w < p->nWordsOut; w++ )
                    pCube1Out[w] &= ~pCube2Out[w];
                // move to another group
                Vec_IntPush( vGroupPrev, iCube2 );
                Vec_IntWriteEntry( vGroup, c2, -1 );
                Count++;
            }
            else if ( Mop_ManCheckContain(pCube2Out, pCube1Out, p->nWordsOut) ) // pCube2 has more outputs
            {
                // update the input part
                for ( w = 0; w < p->nWordsIn; w++ )
                    pCube1[w] &= pCube2[w];
                // sharp the output part
                for ( w = 0; w < p->nWordsOut; w++ )
                    pCube2Out[w] &= ~pCube1Out[w];
                // move to another group
                Vec_IntPush( vGroupPrev, iCube1 );
                Vec_IntWriteEntry( vGroup, c1, -1 );
                Count++;
            }
        }
    }
    if ( Count )
        Map_ManGroupCompact( vGroup );
    return Count;
}